

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::
SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_false>
::grow(SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_false>
       *this,size_t MinSize)

{
  void *pvVar1;
  void *pvVar2;
  bool bVar3;
  size_t sVar4;
  Unparsed *Dest;
  Unparsed *NewElts;
  size_t NewCapacity;
  size_t CurSize;
  size_t CurCapacity;
  size_t MinSize_local;
  SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_false>
  *this_local;
  
  sVar4 = SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_void>
          ::capacity(&this->
                      super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_void>
                    );
  pvVar1 = (this->
           super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_void>
           ).super_SmallVectorBase.EndX;
  pvVar2 = (this->
           super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_void>
           ).super_SmallVectorBase.BeginX;
  NewElts = (Unparsed *)NextPowerOf2(sVar4 + 2);
  if (NewElts < MinSize) {
    NewElts = (Unparsed *)MinSize;
  }
  Dest = (Unparsed *)malloc((long)NewElts * 0x18);
  SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<14u,Fixpp::Type::Float>>,Fixpp::Required<Fixpp::TagT<39u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<151u,Fixpp::Type::Float>>,Fixpp::Required<Fixpp::TagT<84u,Fixpp::Type::Float>>,Fixpp::Required<Fixpp::TagT<6u,Fixpp::Type::Float>>,Fixpp::TagT<103u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>::Unparsed,false>
  ::
  uninitialized_move<Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<14u,Fixpp::Type::Float>>,Fixpp::Required<Fixpp::TagT<39u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<151u,Fixpp::Type::Float>>,Fixpp::Required<Fixpp::TagT<84u,Fixpp::Type::Float>>,Fixpp::Required<Fixpp::TagT<6u,Fixpp::Type::Float>>,Fixpp::TagT<103u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>::Unparsed*,Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<14u,Fixpp::Type::Float>>,Fixpp::Required<Fixpp::TagT<39u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<151u,Fixpp::Type::Float>>,Fixpp::Required<Fixpp::TagT<84u,Fixpp::Type::Float>>,Fixpp::Required<Fixpp::TagT<6u,Fixpp::Type::Float>>,Fixpp::TagT<103u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>::Unparsed*>
            ((Unparsed *)
             (this->
             super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_void>
             ).super_SmallVectorBase.BeginX,
             (Unparsed *)
             (this->
             super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_void>
             ).super_SmallVectorBase.EndX,Dest);
  destroy_range((Unparsed *)
                (this->
                super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_void>
                ).super_SmallVectorBase.BeginX,
                (Unparsed *)
                (this->
                super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_void>
                ).super_SmallVectorBase.EndX);
  bVar3 = SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_void>
          ::isSmall(&this->
                     super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_void>
                   );
  if (!bVar3) {
    free((this->
         super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_void>
         ).super_SmallVectorBase.BeginX);
  }
  SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_void>
  ::setEnd(&this->
            super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_void>
           ,Dest + ((long)pvVar1 - (long)pvVar2) / 0x18);
  (this->
  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_void>
  ).super_SmallVectorBase.BeginX = Dest;
  (this->
  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_void>
  ).super_SmallVectorBase.CapacityX =
       (void *)((long)(this->
                      super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_void>
                      ).super_SmallVectorBase.BeginX + (long)NewElts * 0x18);
  return;
}

Assistant:

void SmallVectorTemplateBase<T, isPodLike>::grow(size_t MinSize) {
  size_t CurCapacity = this->capacity();
  size_t CurSize = this->size();
  // Always grow, even from zero.
  size_t NewCapacity = size_t(NextPowerOf2(CurCapacity+2));
  if (NewCapacity < MinSize)
    NewCapacity = MinSize;
  T *NewElts = static_cast<T*>(malloc(NewCapacity*sizeof(T)));

  // Move the elements over.
  this->uninitialized_move(this->begin(), this->end(), NewElts);

  // Destroy the original elements.
  destroy_range(this->begin(), this->end());

  // If this wasn't grown from the inline copy, deallocate the old space.
  if (!this->isSmall())
    free(this->begin());

  this->setEnd(NewElts+CurSize);
  this->BeginX = NewElts;
  this->CapacityX = this->begin()+NewCapacity;
}